

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void ** __thiscall TCMallocImplementation::ReadHeapGrowthStackTraces(TCMallocImplementation *this)

{
  _func_StackTrace_ptr_void_ptr_ptr *next_fn;
  pointer ppvVar1;
  _lambda_void_const____1_ local_21;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> local_20;
  StackTrace *local_18;
  StackTrace *head;
  TCMallocImplementation *this_local;
  
  head = (StackTrace *)this;
  local_18 = tcmalloc::Static::growth_stacks();
  next_fn = ReadHeapGrowthStackTraces()::{lambda(void_const**)#1}::operator_cast_to_function_pointer
                      (&local_21);
  tcmalloc::ProduceStackTracesDump((tcmalloc *)&local_20,next_fn,local_18);
  ppvVar1 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::release(&local_20);
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr(&local_20);
  return ppvVar1;
}

Assistant:

virtual void** ReadHeapGrowthStackTraces() {
    // Note: growth stacks are append only, and updated atomically. So
    // we can just read them without any locks. And use arbitrarily long
    // (since they're never cleared/deleted).
    const StackTrace* head = Static::growth_stacks();
    return ProduceStackTracesDump(
      +[] (const void** current_head) {
        const StackTrace* current = static_cast<const StackTrace*>(*current_head);
        *current_head = current->stack[tcmalloc::kMaxStackDepth-1];
        return current;
      }, head).release();
  }